

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLNodeHandlerTextArea.cpp
# Opt level: O2

bool __thiscall
Rml::XMLNodeHandlerTextArea::ElementData
          (XMLNodeHandlerTextArea *this,XMLParser *parser,String *data,XMLDataType param_3)

{
  ParseFrame *pPVar1;
  ElementFormControlTextArea *pEVar2;
  SystemInterface *pSVar3;
  String translated_data;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  pPVar1 = XMLParser::GetParseFrame(parser);
  pEVar2 = rmlui_dynamic_cast<Rml::ElementFormControlTextArea*,Rml::Element*>(pPVar1->element);
  if (pEVar2 != (ElementFormControlTextArea *)0x0) {
    local_30 = local_20;
    local_28 = 0;
    local_20[0] = 0;
    pSVar3 = GetSystemInterface();
    (*pSVar3->_vptr_SystemInterface[3])(pSVar3,&local_30,data);
    (*(pEVar2->super_ElementFormControl).super_Element.super_ScriptInterface.super_Releasable.
      _vptr_Releasable[0x19])(pEVar2,&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return true;
}

Assistant:

bool XMLNodeHandlerTextArea::ElementData(XMLParser* parser, const String& data, XMLDataType /*type*/)
{
	ElementFormControlTextArea* text_area = rmlui_dynamic_cast<ElementFormControlTextArea*>(parser->GetParseFrame()->element);
	if (text_area != nullptr)
	{
		// Do any necessary translation.
		String translated_data;
		GetSystemInterface()->TranslateString(translated_data, data);

		text_area->SetValue(translated_data);
	}

	return true;
}